

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBuffers.cpp
# Opt level: O0

void __thiscall aeron::LogBuffers::LogBuffers(LogBuffers *this,char *filename)

{
  int32_t iVar1;
  int64_t iVar2;
  element_type *this_00;
  uint8_t *puVar3;
  undefined8 *in_RDI;
  int i;
  int32_t pageSize;
  int32_t termLength;
  uint8_t *basePtr;
  int64_t logLength;
  int32_t in_stack_00000214;
  shared_ptr<aeron::util::MemoryMappedFile> *in_stack_ffffffffffffff38;
  shared_ptr<aeron::util::MemoryMappedFile> *in_stack_ffffffffffffff40;
  AtomicBuffer *local_58;
  int local_4c;
  char *in_stack_ffffffffffffffc8;
  
  *in_RDI = &PTR__LogBuffers_00227a78;
  std::shared_ptr<aeron::util::MemoryMappedFile>::shared_ptr
            ((shared_ptr<aeron::util::MemoryMappedFile> *)0x1e5db0);
  local_58 = (AtomicBuffer *)(in_RDI + 3);
  do {
    concurrent::AtomicBuffer::AtomicBuffer(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != (AtomicBuffer *)(in_RDI + 0xf));
  iVar2 = util::MemoryMappedFile::getFileSize(in_stack_ffffffffffffffc8);
  util::MemoryMappedFile::mapExisting((char *)in_stack_ffffffffffffff38);
  std::shared_ptr<aeron::util::MemoryMappedFile>::operator=
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::shared_ptr<aeron::util::MemoryMappedFile>::~shared_ptr
            ((shared_ptr<aeron::util::MemoryMappedFile> *)0x1e5e5a);
  this_00 = std::
            __shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1e5e64);
  puVar3 = util::MemoryMappedFile::getMemoryPtr(this_00);
  concurrent::AtomicBuffer::wrap((AtomicBuffer *)(in_RDI + 0xc),puVar3 + iVar2 + -0x1000,0x1000);
  iVar1 = concurrent::logbuffer::LogBufferDescriptor::termLength((AtomicBuffer *)0x1e5ebb);
  concurrent::logbuffer::LogBufferDescriptor::pageSize((AtomicBuffer *)0x1e5eda);
  concurrent::logbuffer::LogBufferDescriptor::checkTermLength(in_stack_00000214);
  concurrent::logbuffer::LogBufferDescriptor::checkPageSize(in_stack_00000214);
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    concurrent::AtomicBuffer::wrap
              ((AtomicBuffer *)(in_RDI + (long)local_4c * 3 + 3),puVar3 + local_4c * iVar1,
               (long)iVar1);
  }
  return;
}

Assistant:

LogBuffers::LogBuffers(const char *filename)
{
    const std::int64_t logLength = MemoryMappedFile::getFileSize(filename);

    m_memoryMappedFiles = MemoryMappedFile::mapExisting(filename);

    std::uint8_t *basePtr = m_memoryMappedFiles->getMemoryPtr();

    m_buffers[LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX]
        .wrap(basePtr + (logLength - LogBufferDescriptor::LOG_META_DATA_LENGTH),
            LogBufferDescriptor::LOG_META_DATA_LENGTH);

    const std::int32_t termLength = LogBufferDescriptor::termLength(
        m_buffers[LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX]);
    const std::int32_t pageSize = LogBufferDescriptor::pageSize(
        m_buffers[LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX]);

    LogBufferDescriptor::checkTermLength(termLength);
    LogBufferDescriptor::checkPageSize(pageSize);

    for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
    {
        m_buffers[i].wrap(basePtr + (i * termLength), termLength);
    }
}